

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O2

int Imf_3_2::SplitChannels<Imf_3_2::MultiViewChannelName*>
              (MultiViewChannelName **begin,MultiViewChannelName **end,bool multipart,
              string *heroView)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __type _Var1;
  bool bVar2;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  const_iterator cVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  undefined7 in_register_00000011;
  MultiViewChannelName *pMVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  _Self __tmp;
  string *this_00;
  _Self __tmp_1;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  layerToPart;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  viewsInLayers;
  string lname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000011,multipart) == 0) {
    iVar8 = 1;
    for (this_00 = (string *)&(*begin)->internal_name;
        pMVar7 = (MultiViewChannelName *)(this_00 + -0x48), pMVar7 != *end; this_00 = this_00 + 0x68
        ) {
      *(undefined4 *)(this_00 + -8) = 0;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this_00 + -0x28)
      ;
      bVar2 = std::operator==(__lhs,"");
      if (bVar2) {
        std::__cxx11::string::_M_assign(this_00);
      }
      else {
        MultiViewChannelName::getLayer_abi_cxx11_(&lname,pMVar7);
        bVar2 = std::operator==(&lname,"");
        if (bVar2) {
          _Var1 = std::operator==(__lhs,heroView);
          if (!_Var1) {
            __return_storage_ptr__ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&layerToPart;
            std::operator+(__return_storage_ptr__,__lhs,".");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &viewsInLayers,__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pMVar7);
            std::__cxx11::string::operator=(this_00,(string *)&viewsInLayers);
            std::__cxx11::string::~string((string *)&viewsInLayers);
            goto LAB_001803a6;
          }
          std::__cxx11::string::_M_assign(this_00);
        }
        else {
          std::operator+(&local_70,&lname,".");
          std::operator+(&local_90,&local_70,__lhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &layerToPart,&local_90,".");
          MultiViewChannelName::getSuffix_abi_cxx11_(&local_50,pMVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &viewsInLayers,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &layerToPart,&local_50);
          std::__cxx11::string::operator=(this_00,(string *)&viewsInLayers);
          std::__cxx11::string::~string((string *)&viewsInLayers);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&layerToPart);
          std::__cxx11::string::~string((string *)&local_90);
          __return_storage_ptr__ = &local_70;
LAB_001803a6:
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)&lname);
      }
    }
  }
  else {
    viewsInLayers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &viewsInLayers._M_t._M_impl.super__Rb_tree_header._M_header;
    viewsInLayers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    viewsInLayers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    viewsInLayers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    viewsInLayers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         viewsInLayers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pMVar7 = *begin; pMVar7 != *end; pMVar7 = pMVar7 + 1) {
      MultiViewChannelName::getLayer_abi_cxx11_(&lname,pMVar7);
      this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&viewsInLayers,&lname);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(this,&pMVar7->view);
      std::__cxx11::string::~string((string *)&lname);
    }
    layerToPart._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &layerToPart._M_t._M_impl.super__Rb_tree_header._M_header;
    layerToPart._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    layerToPart._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    layerToPart._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar8 = 0;
    layerToPart._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         layerToPart._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var6 = viewsInLayers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &viewsInLayers._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(p_Var6 + 2),heroView);
      if (cVar3._M_node != (_Base_ptr)&p_Var6[2]._M_parent) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&lname,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1)
                   ,heroView);
        pmVar4 = std::
                 map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                 ::operator[](&layerToPart,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&lname);
        *pmVar4 = iVar8;
        iVar8 = iVar8 + 1;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&lname);
      }
      for (p_Var5 = p_Var6[2]._M_right; p_Var5 != (_Base_ptr)&p_Var6[2]._M_parent;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var5 + 1),heroView);
        if (bVar2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&lname,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 1),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var5 + 1));
          pmVar4 = std::
                   map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                   ::operator[](&layerToPart,
                                (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&lname);
          *pmVar4 = iVar8;
          iVar8 = iVar8 + 1;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&lname);
        }
      }
    }
    for (pMVar7 = *begin; pMVar7 != *end; pMVar7 = pMVar7 + 1) {
      std::__cxx11::string::_M_assign((string *)&pMVar7->internal_name);
      MultiViewChannelName::getLayer_abi_cxx11_(&local_90,pMVar7);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&lname,&local_90,&pMVar7->view);
      pmVar4 = std::
               map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
               ::operator[](&layerToPart,
                            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&lname);
      pMVar7->part_number = *pmVar4;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&lname);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
    ::~_Rb_tree(&layerToPart._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&viewsInLayers._M_t);
  }
  return iVar8;
}

Assistant:

inline int
SplitChannels (
    const T&           begin,
    const T&           end,
    bool               multipart = true,
    const std::string& heroView  = std::string ())
{
    if (!multipart)
    {
        for (T i = begin; i != end; i++)
        {
            i->part_number = 0;

            //does this have a view name set?
            if (i->view == "") { i->internal_name = i->name; }
            else
            {

                std::string lname = i->getLayer ();

                // no layer, only non-hero views get view name in layer name

                if (lname == "")
                {
                    if (i->view == heroView) { i->internal_name = i->name; }
                    else
                    {
                        i->internal_name = i->view + "." + i->name;
                    }
                }
                else
                {
                    i->internal_name =
                        lname + "." + i->view + "." + i->getSuffix ();
                }
            }
        }
        // single part created
        return 1;
    }
    else
    {
        // step 1: extract individual layers and parts
        // for each layer, enumerate which views are active

        std::map<std::string, std::set<std::string>> viewsInLayers;
        for (T i = begin; i != end; i++)
        {
            viewsInLayers[i->getLayer ()].insert (i->view);
        }

        // step 2: assign a part number to each layer/view

        std::map<std::pair<std::string, std::string>, int> layerToPart;

        int partCount = 0;

        for (std::map<std::string, std::set<std::string>>::const_iterator
                 layer = viewsInLayers.begin ();
             layer != viewsInLayers.end ();
             layer++)
        {
            // if this layer has a heroView, insert that first
            bool layer_has_hero =
                layer->second.find (heroView) != layer->second.end ();
            if (layer_has_hero)
            {
                layerToPart[std::make_pair (layer->first, heroView)] =
                    partCount++;
            }

            // insert other layers which aren't the hero view
            for (std::set<std::string>::const_iterator view =
                     layer->second.begin ();
                 view != layer->second.end ();
                 view++)
            {
                if (*view != heroView)
                {
                    layerToPart[std::make_pair (layer->first, *view)] =
                        partCount++;
                }
            }
        }

        // step 3: update part number of each provided channel

        for (T i = begin; i != end; i++)
        {
            i->internal_name = i->name;
            i->part_number =
                layerToPart[std::make_pair (i->getLayer (), i->view)];
        }

        // return number of parts created
        return partCount;
    }
}